

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<double,double,duckdb::GreaterThanEquals,false,false,false,true>
                (double *ldata,double *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  ulong uVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  bool bVar5;
  ulong uVar6;
  sel_t sVar7;
  double *pdVar8;
  double *pdVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  
  if (count + 0x3f < 0x40) {
    lVar12 = 0;
  }
  else {
    lVar12 = 0;
    uVar11 = 0;
    uVar10 = 0;
    do {
      puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      uVar6 = uVar11;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar13 = uVar11 + 0x40;
        if (count <= uVar11 + 0x40) {
          uVar13 = count;
        }
LAB_00445000:
        if (uVar11 < uVar13) {
          pdVar9 = rdata + uVar11;
          pdVar8 = ldata + uVar11;
          do {
            uVar6 = uVar11;
            if (sel->sel_vector != (sel_t *)0x0) {
              uVar6 = (ulong)sel->sel_vector[uVar11];
            }
            bVar5 = GreaterThanEquals::Operation<double>(pdVar8,pdVar9);
            false_sel->sel_vector[lVar12] = (sel_t)uVar6;
            lVar12 = lVar12 + (ulong)!bVar5;
            uVar11 = uVar11 + 1;
            pdVar9 = pdVar9 + 1;
            pdVar8 = pdVar8 + 1;
            uVar6 = uVar13;
          } while (uVar13 != uVar11);
        }
      }
      else {
        uVar2 = puVar1[uVar10];
        uVar13 = uVar11 + 0x40;
        if (count <= uVar11 + 0x40) {
          uVar13 = count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_00445000;
        if (uVar2 == 0) {
          uVar6 = uVar13;
          if (uVar11 < uVar13) {
            psVar3 = sel->sel_vector;
            psVar4 = false_sel->sel_vector;
            do {
              sVar7 = (sel_t)uVar11;
              if (psVar3 != (sel_t *)0x0) {
                sVar7 = psVar3[uVar11];
              }
              psVar4[lVar12] = sVar7;
              lVar12 = lVar12 + 1;
              uVar11 = uVar11 + 1;
            } while (uVar13 != uVar11);
          }
        }
        else if (uVar11 < uVar13) {
          pdVar9 = rdata + uVar11;
          pdVar8 = ldata + uVar11;
          uVar14 = 0;
          do {
            if (sel->sel_vector == (sel_t *)0x0) {
              sVar7 = (int)uVar14 + (int)uVar11;
            }
            else {
              sVar7 = sel->sel_vector[uVar11 + uVar14];
            }
            if ((uVar2 >> (uVar14 & 0x3f) & 1) == 0) {
              uVar6 = 1;
            }
            else {
              bVar5 = GreaterThanEquals::Operation<double>(pdVar8,pdVar9);
              uVar6 = (ulong)!bVar5;
            }
            false_sel->sel_vector[lVar12] = sVar7;
            lVar12 = lVar12 + uVar6;
            uVar14 = uVar14 + 1;
            pdVar9 = pdVar9 + 1;
            pdVar8 = pdVar8 + 1;
            uVar6 = uVar13;
          } while (uVar13 - uVar11 != uVar14);
        }
      }
      uVar11 = uVar6;
      uVar10 = uVar10 + 1;
    } while (uVar10 != count + 0x3f >> 6);
  }
  return count - lVar12;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}